

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O1

void sbfTport_destroy(sbfTport tport)

{
  sbfMutex *__mutex;
  sbfTportStreamImpl *psVar1;
  sbfMwThread psVar2;
  undefined8 *puVar3;
  
  sbfLog_log(tport->mLog,0,"destroying transport %p",tport);
  __mutex = &tport->mStreamsLock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  for (psVar1 = (tport->mStreams).tqh_first; psVar1 != (sbfTportStreamImpl *)0x0;
      psVar1 = (psVar1->mEntry).tqe_next) {
    puVar3 = (undefined8 *)sbfMemory_malloc(0x98);
    *puVar3 = tport;
    puVar3[1] = psVar1;
    psVar2 = psVar1->mThread;
    puVar3[2] = psVar2;
    sbfMw_enqueueThread(psVar2,puVar3 + 3,sbfTportFirstDestroyStreamCb,puVar3);
    tport->mStreamsWaiting = tport->mStreamsWaiting + 1;
  }
  if (tport->mStreamsWaiting != 0) {
    do {
      sbfLog_log(tport->mLog,0,"transport %p waiting for %u streams",tport);
      pthread_cond_wait((pthread_cond_t *)&tport->mStreamsCondVar,(pthread_mutex_t *)__mutex);
    } while (tport->mStreamsWaiting != 0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  (*tport->mHandlerTable->mDestroy)(tport->mHandler);
  sbfLog_log(tport->mLog,0,"freeing transport %p",tport);
  sbfTportFree(tport);
  return;
}

Assistant:

void
sbfTport_destroy (sbfTport tport)
{
    sbfTportStream                tstream;
    sbfTportDestroyStreamClosure* closure0;

    sbfLog_debug (tport->mLog, "destroying transport %p", tport);

    sbfMutex_lock (&tport->mStreamsLock);
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        closure0 = xmalloc (sizeof *closure0);
        closure0->mTport = tport;
        closure0->mTportStream = tstream;

        closure0->mThread = tstream->mThread;
        sbfMw_enqueueThread (closure0->mThread,
                             &closure0->mEvent,
                             sbfTportFirstDestroyStreamCb,
                             closure0);

        tport->mStreamsWaiting++;
    }
    while (tport->mStreamsWaiting != 0)
    {
        sbfLog_debug (tport->mLog,
                      "transport %p waiting for %u streams",
                      tport,
                      tport->mStreamsWaiting);
        sbfCondVar_wait (&tport->mStreamsCondVar, &tport->mStreamsLock);
    }
    sbfMutex_unlock (&tport->mStreamsLock);

    tport->mHandlerTable->mDestroy (tport->mHandler);

    sbfLog_debug (tport->mLog, "freeing transport %p", tport);
    sbfTportFree (tport);
}